

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O0

void apply_blur(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float blurness)

{
  bool bVar1;
  ostream *poVar2;
  Point_<int> local_84;
  Size_<int> local_7c [2];
  _OutputArray local_68;
  _InputArray local_50;
  Mat *local_38;
  Mat *img;
  iterator __end1;
  iterator __begin1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *__range1;
  float blurness_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)color::blue_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"Adjusting Blur : ");
  std::operator<<(poVar2,(string *)color::reset_abi_cxx11_);
  __end1 = CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin(image_list);
  img = (Mat *)CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end(image_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                                *)&img);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
               operator*(&__end1);
    cv::_InputArray::_InputArray(&local_50,local_38);
    cv::_OutputArray::_OutputArray(&local_68,local_38);
    cv::Size_<int>::Size_(local_7c,(int)blurness,(int)blurness);
    cv::Point_<int>::Point_(&local_84,-1,-1);
    cv::blur(&local_50,&local_68,local_7c,&local_84,4);
    cv::_OutputArray::~_OutputArray(&local_68);
    cv::_InputArray::~_InputArray(&local_50);
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)color::green_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"Done");
  poVar2 = std::operator<<(poVar2,(string *)color::reset_abi_cxx11_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void apply_blur(std::vector<cv::Mat> &image_list, float blurness) {
   std::cout << color::blue << "Adjusting Blur : " << color::reset;   
   for(auto &img: image_list) {
      blur(img, img, Size(blurness, blurness));
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}